

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

int av1_get_eob_pos_token(int eob,int *extra)

{
  char cVar1;
  uint uVar2;
  int8_t *piVar3;
  ulong uVar4;
  
  if (eob < 0x21) {
    uVar4 = (ulong)eob;
    piVar3 = "";
  }
  else {
    uVar2 = eob - 1U >> 5;
    uVar4 = 0x10;
    if (uVar2 < 0x10) {
      uVar4 = (ulong)uVar2;
    }
    piVar3 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v";
  }
  cVar1 = piVar3[uVar4];
  *extra = eob - av1_eob_group_start[cVar1];
  return (int)cVar1;
}

Assistant:

int av1_get_eob_pos_token(const int eob, int *const extra) {
  int t;

  if (eob < 33) {
    t = eob_to_pos_small[eob];
  } else {
    const int e = AOMMIN((eob - 1) >> 5, 16);
    t = eob_to_pos_large[e];
  }

  *extra = eob - av1_eob_group_start[t];

  return t;
}